

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

int logging_set_level(char *filename,int level)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  file_data *pfVar4;
  undefined1 local_30 [16];
  iterator i;
  int result;
  int all_files;
  int level_local;
  char *filename_local;
  
  iVar2 = strcmp("all",filename);
  i.mNode._4_4_ = 0;
  JetHead::list<file_data>::begin((list<file_data> *)(local_30 + 8));
  do {
    JetHead::list<file_data>::end((list<file_data> *)local_30);
    bVar1 = JetHead::list<file_data>::iterator::operator!=
                      ((iterator *)(local_30 + 8),(iterator *)local_30);
    JetHead::list<file_data>::iterator::~iterator((iterator *)local_30);
    if (!bVar1) {
      JetHead::list<file_data>::iterator::~iterator((iterator *)(local_30 + 8));
      return i.mNode._4_4_;
    }
    if (iVar2 == 0) {
LAB_001370a5:
      pfVar4 = JetHead::list<file_data>::iterator::operator->((iterator *)(local_30 + 8));
      *pfVar4->level = level;
      i.mNode._4_4_ = 1;
    }
    else {
      pfVar4 = JetHead::list<file_data>::iterator::operator->((iterator *)(local_30 + 8));
      iVar3 = strcmp(pfVar4->filename,filename);
      if (iVar3 == 0) goto LAB_001370a5;
    }
    JetHead::list<file_data>::iterator::operator++((iterator *)(local_30 + 8));
  } while( true );
}

Assistant:

int logging_set_level( const char *filename, int level )
{
	int all_files = ( strcmp( "all", filename ) == 0 );
	int result = 0;
	
	TRACE_BEGIN(LOG_LVL_INFO);
	LOG( "changing logging properties on file %s\n", filename );

	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		if ( all_files == 1 || strcmp(i->filename, filename) == 0 )
		{
			*(i->level) = level;
			result = 1;
		}
	}

	// Seems like everything came out OK
	TRACE_END();
	return result;
}